

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

string * __thiscall
front::irGenerator::irGenerator::getStringName_abi_cxx11_
          (string *__return_storage_ptr__,irGenerator *this,uint32_t id)

{
  size_type *psVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 uVar5;
  char cVar6;
  char cVar7;
  undefined8 *puVar8;
  uint32_t uVar9;
  ulong uVar10;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_60;
  uint local_58;
  undefined4 uStack_54;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  pcVar3 = (this->_StringNamePrefix)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (this->_StringNamePrefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  cVar7 = '\x01';
  if (9 < id) {
    uVar9 = id;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar9 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0017dcee;
      }
      if (uVar9 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0017dcee;
      }
      if (uVar9 < 10000) goto LAB_0017dcee;
      bVar4 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar4);
    cVar7 = cVar7 + '\x01';
  }
LAB_0017dcee:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60,local_58,id);
  uVar2 = CONCAT44(uStack_54,local_58) + local_38;
  uVar10 = 0xf;
  if (local_40 != local_30) {
    uVar10 = local_30[0];
  }
  if (uVar10 < uVar2) {
    uVar10 = 0xf;
    if (local_60 != local_50) {
      uVar10 = local_50[0];
    }
    if (uVar2 <= uVar10) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_0017dd6f;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_0017dd6f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    uVar5 = puVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string irGenerator::getStringName(uint32_t id) {
  return _StringNamePrefix + "_" + std::to_string(id);
}